

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ircbot.cpp
# Opt level: O1

void __thiscall ircBot::ParseMessage(ircBot *this,char *buff)

{
  char *__dest;
  int iVar1;
  size_t sVar2;
  
  sVar2 = strlen(buff);
  if (sVar2 < 1000) {
    __dest = (this->msg).chan;
    iVar1 = __isoc99_sscanf(buff,":%[^!]!%[^@]@%[^ ] %*[^ ] %[^ :] :%[^\r\n]",&this->msg,
                            (this->msg).user,(this->msg).host,__dest,(this->msg).message);
    if (iVar1 == 5) {
      (this->msg).is_ready = 1;
      if ((this->msg).chan[0] != '#') {
        strcpy(__dest,(this->msg).nick);
        return;
      }
    }
    else {
      (this->msg).is_ready = 0;
    }
  }
  return;
}

Assistant:

void ircBot::ParseMessage(char *buff){
    if(strlen(buff) < 1000) { //check buffer size to allow safe sscanf: was 100 w/o seg
        if(sscanf(buff,":%[^!]!%[^@]@%[^ ] %*[^ ] %[^ :] :%[^\r\n]",msg.nick,msg.user,msg.host,msg.chan,msg.message) == 5){
            msg.is_ready = 1;
            if(msg.chan[0] != '#') strcpy(msg.chan,msg.nick);
        } else msg.is_ready = 0;
    }
}